

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O2

JavascriptString *
Js::ScriptFunction::GetComputedName(Var computedNameVar,ScriptContext *scriptContext)

{
  bool bVar1;
  JavascriptString *pJVar2;
  
  if (computedNameVar == (Var)0x0) {
    return (JavascriptString *)0x0;
  }
  bVar1 = TaggedInt::Is(computedNameVar);
  if (bVar1) {
    pJVar2 = TaggedInt::ToString(computedNameVar,scriptContext);
    return pJVar2;
  }
  pJVar2 = JavascriptConversion::ToString(computedNameVar,scriptContext);
  return pJVar2;
}

Assistant:

JavascriptString* ScriptFunction::GetComputedName(Var computedNameVar, ScriptContext * scriptContext)
    {
        JavascriptString* computedName = nullptr;
        if (computedNameVar != nullptr)
        {
            if (TaggedInt::Is(computedNameVar))
            {
                computedName = TaggedInt::ToString(computedNameVar, scriptContext);
            }
            else
            {
                computedName = JavascriptConversion::ToString(computedNameVar, scriptContext);
            }
            return computedName;
        }
        return nullptr;
    }